

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int robust_open(char *z,int f,mode_t m)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  uint uVar4;
  stat statbuf;
  
  uVar4 = 0x1a4;
  if (m != 0) {
    uVar4 = m;
  }
  while( true ) {
    while (uVar1 = (*aSyscall[0].pCurrent)(z,(ulong)(f | 0x80000),(ulong)uVar4), (int)uVar1 < 0) {
      piVar3 = __errno_location();
      if (*piVar3 != 4) {
        return uVar1;
      }
    }
    if (2 < uVar1) break;
    if ((f & 0xc0U) == 0xc0) {
      (*aSyscall[0x10].pCurrent)(z);
    }
    (*aSyscall[1].pCurrent)((ulong)uVar1);
    sqlite3_log(0x1c,"attempt to open \"%s\" as file descriptor %d",z,(ulong)uVar1);
    iVar2 = (*aSyscall[0].pCurrent)("/dev/null",0,(ulong)m);
    if (iVar2 < 0) {
      return -1;
    }
  }
  if (m == 0) {
    return uVar1;
  }
  iVar2 = (*aSyscall[5].pCurrent)((ulong)uVar1,&statbuf);
  if (iVar2 != 0) {
    return uVar1;
  }
  if (statbuf.st_size != 0) {
    return uVar1;
  }
  if ((statbuf.st_mode & 0x1ff) == m) {
    return uVar1;
  }
  (*aSyscall[0xe].pCurrent)((ulong)uVar1,(ulong)m);
  return uVar1;
}

Assistant:

static int robust_open(const char *z, int f, mode_t m){
  int fd;
  mode_t m2 = m ? m : SQLITE_DEFAULT_FILE_PERMISSIONS;
  while(1){
#if defined(O_CLOEXEC)
    fd = osOpen(z,f|O_CLOEXEC,m2);
#else
    fd = osOpen(z,f,m2);
#endif
    if( fd<0 ){
      if( errno==EINTR ) continue;
      break;
    }
    if( fd>=SQLITE_MINIMUM_FILE_DESCRIPTOR ) break;
    if( (f & (O_EXCL|O_CREAT))==(O_EXCL|O_CREAT) ){
      (void)osUnlink(z);
    }
    osClose(fd);
    sqlite3_log(SQLITE_WARNING,
                "attempt to open \"%s\" as file descriptor %d", z, fd);
    fd = -1;
    if( osOpen("/dev/null", O_RDONLY, m)<0 ) break;
  }
  if( fd>=0 ){
    if( m!=0 ){
      struct stat statbuf;
      if( osFstat(fd, &statbuf)==0
       && statbuf.st_size==0
       && (statbuf.st_mode&0777)!=m
      ){
        osFchmod(fd, m);
      }
    }
#if defined(FD_CLOEXEC) && (!defined(O_CLOEXEC) || O_CLOEXEC==0)
    osFcntl(fd, F_SETFD, osFcntl(fd, F_GETFD, 0) | FD_CLOEXEC);
#endif
  }
  return fd;
}